

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&>
          (string *__return_storage_ptr__,spirv_cross *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2)

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> SStack_1118;
  
  StringStream<4096UL,_4096UL>::StringStream(&SStack_1118);
  inner::join_helper<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&>
            (&SStack_1118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [2])ts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&SStack_1118);
  StringStream<4096UL,_4096UL>::~StringStream(&SStack_1118);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}